

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O0

void fdct16x16_new_avx2(__m256i *input,__m256i *output,int8_t cos_bit)

{
  __m256i in1;
  __m256i in1_00;
  __m256i in1_01;
  __m256i in1_02;
  __m256i in1_03;
  __m256i in1_04;
  __m256i in1_05;
  __m256i in1_06;
  __m256i in0;
  __m256i in0_00;
  __m256i in0_01;
  __m256i in0_02;
  __m256i in0_03;
  __m256i in0_04;
  __m256i in0_05;
  __m256i in0_06;
  __m256i _r_00;
  __m256i _r_01;
  __m256i _r_02;
  __m256i _r_03;
  __m256i _r_04;
  __m256i _r_05;
  __m256i _r_06;
  __m256i _r_07;
  __m256i _r_08;
  __m256i _r_09;
  __m256i _r_10;
  __m256i _r_11;
  __m256i _r_12;
  __m256i w1;
  __m256i w1_00;
  __m256i w1_01;
  __m256i w1_02;
  __m256i w1_03;
  __m256i w1_04;
  __m256i w1_05;
  __m256i w1_06;
  __m256i w1_07;
  __m256i w1_08;
  __m256i w1_09;
  __m256i w1_10;
  __m256i w1_11;
  __m256i w0;
  __m256i w0_00;
  __m256i w0_01;
  __m256i w0_02;
  __m256i w0_03;
  __m256i w0_04;
  __m256i w0_05;
  __m256i w0_06;
  __m256i w0_07;
  __m256i w0_08;
  __m256i w0_09;
  __m256i w0_10;
  __m256i w0_11;
  uint uVar1;
  char in_DL;
  undefined8 *in_RSI;
  undefined1 auVar2 [16];
  __m256i *in1_07;
  longlong lVar3;
  undefined1 auVar4 [16];
  __m256i x1 [16];
  __m256i cospi_m52_p12;
  __m256i cospi_p12_p52;
  __m256i cospi_m20_p44;
  __m256i cospi_p44_p20;
  __m256i cospi_m36_p28;
  __m256i cospi_p28_p36;
  __m256i cospi_m04_p60;
  __m256i cospi_p60_p04;
  __m256i cospi_m40_p24;
  __m256i cospi_p24_p40;
  __m256i cospi_m08_p56;
  __m256i cospi_p56_p08;
  __m256i cospi_m48_m16;
  __m256i cospi_m16_p48;
  __m256i cospi_p48_p16;
  __m256i cospi_p32_m32;
  __m256i cospi_p32_p32;
  __m256i cospi_m32_p32;
  __m256i _r;
  int32_t *cospi;
  undefined8 local_520;
  undefined8 uStackY_518;
  int16_t in_stack_fffffffffffffaf0;
  int16_t in_stack_fffffffffffffaf2;
  undefined4 uStack_50c;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 in_stack_fffffffffffffb18;
  undefined8 in_stack_fffffffffffffb20;
  __m256i *in_stack_fffffffffffffb28;
  __m256i *in_stack_fffffffffffffb30;
  undefined8 in_stack_fffffffffffffb38;
  undefined8 in_stack_fffffffffffffb40;
  undefined8 in_stack_fffffffffffffb48;
  longlong in_stack_fffffffffffffb50;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  __m256i *in_stack_fffffffffffffb68;
  __m256i *in_stack_fffffffffffffb70;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 uStack_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined4 uStack_350;
  int32_t in_stack_fffffffffffffcb4;
  undefined8 in_stack_fffffffffffffcb8;
  undefined8 in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  longlong in_stack_fffffffffffffcd0;
  undefined8 uStack_328;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  cospi_arr((int)in_DL);
  uVar1 = 1 << (in_DL - 1U & 0x1f);
  auVar7 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar7 = vpinsrd_avx(auVar7,uVar1,2);
  auVar7 = vpinsrd_avx(auVar7,uVar1,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar1),uVar1,1);
  auVar5 = vpinsrd_avx(auVar5,uVar1,2);
  auVar5 = vpinsrd_avx(auVar5,uVar1,3);
  auVar2 = ZEXT116(0) * auVar7 + ZEXT116(1) * auVar5;
  auVar4 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar7;
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  lVar3 = auVar4._0_8_;
  auVar7 = auVar2;
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  auVar5 = auVar2;
  auVar6 = auVar4;
  pair_set_w16_epi16(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0);
  in1_07 = auVar2._8_8_;
  in0[1] = in_stack_fffffffffffffb40;
  in0[0] = in_stack_fffffffffffffb38;
  in0[2] = in_stack_fffffffffffffb48;
  in0[3] = in_stack_fffffffffffffb50;
  in1[1] = in_stack_fffffffffffffb20;
  in1[0] = in_stack_fffffffffffffb18;
  in1[2] = (longlong)in_stack_fffffffffffffb28;
  in1[3] = (longlong)in_stack_fffffffffffffb30;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in0,in1);
  in0_00[1] = in_stack_fffffffffffffb40;
  in0_00[0] = in_stack_fffffffffffffb38;
  in0_00[2] = in_stack_fffffffffffffb48;
  in0_00[3] = in_stack_fffffffffffffb50;
  in1_00[1] = in_stack_fffffffffffffb20;
  in1_00[0] = in_stack_fffffffffffffb18;
  in1_00[2] = (longlong)in_stack_fffffffffffffb28;
  in1_00[3] = (longlong)in_stack_fffffffffffffb30;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in0_00,in1_00);
  in0_01[1] = in_stack_fffffffffffffb40;
  in0_01[0] = in_stack_fffffffffffffb38;
  in0_01[2] = in_stack_fffffffffffffb48;
  in0_01[3] = in_stack_fffffffffffffb50;
  in1_01[1] = in_stack_fffffffffffffb20;
  in1_01[0] = in_stack_fffffffffffffb18;
  in1_01[2] = (longlong)in_stack_fffffffffffffb28;
  in1_01[3] = (longlong)in_stack_fffffffffffffb30;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in0_01,in1_01);
  in0_02[1] = in_stack_fffffffffffffb40;
  in0_02[0] = in_stack_fffffffffffffb38;
  in0_02[2] = in_stack_fffffffffffffb48;
  in0_02[3] = in_stack_fffffffffffffb50;
  in1_02[1] = in_stack_fffffffffffffb20;
  in1_02[0] = in_stack_fffffffffffffb18;
  in1_02[2] = (longlong)in_stack_fffffffffffffb28;
  in1_02[3] = (longlong)in_stack_fffffffffffffb30;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in0_02,in1_02);
  in0_03[1] = in_stack_fffffffffffffb40;
  in0_03[0] = in_stack_fffffffffffffb38;
  in0_03[2] = in_stack_fffffffffffffb48;
  in0_03[3] = in_stack_fffffffffffffb50;
  in1_03[1] = in_stack_fffffffffffffb20;
  in1_03[0] = in_stack_fffffffffffffb18;
  in1_03[2] = (longlong)in_stack_fffffffffffffb28;
  in1_03[3] = (longlong)in_stack_fffffffffffffb30;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in0_03,in1_03);
  in0_04[1] = in_stack_fffffffffffffb40;
  in0_04[0] = in_stack_fffffffffffffb38;
  in0_04[2] = in_stack_fffffffffffffb48;
  in0_04[3] = in_stack_fffffffffffffb50;
  in1_04[1] = in_stack_fffffffffffffb20;
  in1_04[0] = in_stack_fffffffffffffb18;
  in1_04[2] = (longlong)in_stack_fffffffffffffb28;
  in1_04[3] = (longlong)in_stack_fffffffffffffb30;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in0_04,in1_04);
  in0_05[1] = in_stack_fffffffffffffb40;
  in0_05[0] = in_stack_fffffffffffffb38;
  in0_05[2] = in_stack_fffffffffffffb48;
  in0_05[3] = in_stack_fffffffffffffb50;
  in1_05[1] = in_stack_fffffffffffffb20;
  in1_05[0] = in_stack_fffffffffffffb18;
  in1_05[2] = (longlong)in_stack_fffffffffffffb28;
  in1_05[3] = (longlong)in_stack_fffffffffffffb30;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in0_05,in1_05);
  in0_06[1] = in_stack_fffffffffffffb40;
  in0_06[0] = in_stack_fffffffffffffb38;
  in0_06[2] = in_stack_fffffffffffffb48;
  in0_06[3] = in_stack_fffffffffffffb50;
  in1_06[1] = in_stack_fffffffffffffb20;
  in1_06[0] = in_stack_fffffffffffffb18;
  in1_06[2] = (longlong)in_stack_fffffffffffffb28;
  in1_06[3] = (longlong)in_stack_fffffffffffffb30;
  btf_16_adds_subs_out_avx2(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,in0_06,in1_06);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  w0[1] = auVar7._0_8_;
  w0[0] = auVar6._8_8_;
  w0[2] = auVar7._8_8_;
  w0[3] = lVar3;
  w1[1] = auVar5._0_8_;
  w1[0] = auVar4._8_8_;
  w1[2] = auVar5._8_8_;
  w1[3] = auVar6._0_8_;
  _r_00[1] = in_stack_fffffffffffffcc0;
  _r_00[0] = in_stack_fffffffffffffcb8;
  _r_00[2] = in_stack_fffffffffffffcc8;
  _r_00[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0,w1,auVar4._0_8_,in1_07,_r_00,in_stack_fffffffffffffcb4);
  w0_00[1] = auVar7._0_8_;
  w0_00[0] = auVar6._8_8_;
  w0_00[2] = auVar7._8_8_;
  w0_00[3] = lVar3;
  w1_00[1] = auVar5._0_8_;
  w1_00[0] = auVar4._8_8_;
  w1_00[2] = auVar5._8_8_;
  w1_00[3] = auVar6._0_8_;
  _r_01[1] = in_stack_fffffffffffffcc0;
  _r_01[0] = in_stack_fffffffffffffcb8;
  _r_01[2] = in_stack_fffffffffffffcc8;
  _r_01[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_00,w1_00,auVar4._0_8_,in1_07,_r_01,in_stack_fffffffffffffcb4);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  w0_01[1] = auVar7._0_8_;
  w0_01[0] = auVar6._8_8_;
  w0_01[2] = auVar7._8_8_;
  w0_01[3] = lVar3;
  w1_01[1] = auVar5._0_8_;
  w1_01[0] = auVar4._8_8_;
  w1_01[2] = auVar5._8_8_;
  w1_01[3] = auVar6._0_8_;
  _r_02[1] = in_stack_fffffffffffffcc0;
  _r_02[0] = in_stack_fffffffffffffcb8;
  _r_02[2] = in_stack_fffffffffffffcc8;
  _r_02[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_01,w1_01,auVar4._0_8_,in1_07,_r_02,in_stack_fffffffffffffcb4);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  w0_02[1] = auVar7._0_8_;
  w0_02[0] = auVar6._8_8_;
  w0_02[2] = auVar7._8_8_;
  w0_02[3] = lVar3;
  w1_02[1] = auVar5._0_8_;
  w1_02[0] = auVar4._8_8_;
  w1_02[2] = auVar5._8_8_;
  w1_02[3] = auVar6._0_8_;
  _r_03[1] = in_stack_fffffffffffffcc0;
  _r_03[0] = in_stack_fffffffffffffcb8;
  _r_03[2] = in_stack_fffffffffffffcc8;
  _r_03[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_02,w1_02,auVar4._0_8_,in1_07,_r_03,in_stack_fffffffffffffcb4);
  w0_03[1] = auVar7._0_8_;
  w0_03[0] = auVar6._8_8_;
  w0_03[2] = auVar7._8_8_;
  w0_03[3] = lVar3;
  w1_03[1] = auVar5._0_8_;
  w1_03[0] = auVar4._8_8_;
  w1_03[2] = auVar5._8_8_;
  w1_03[3] = auVar6._0_8_;
  _r_04[1] = in_stack_fffffffffffffcc0;
  _r_04[0] = in_stack_fffffffffffffcb8;
  _r_04[2] = in_stack_fffffffffffffcc8;
  _r_04[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_03,w1_03,auVar4._0_8_,in1_07,_r_04,in_stack_fffffffffffffcb4);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  w0_04[1] = auVar7._0_8_;
  w0_04[0] = auVar6._8_8_;
  w0_04[2] = auVar7._8_8_;
  w0_04[3] = lVar3;
  w1_04[1] = auVar5._0_8_;
  w1_04[0] = auVar4._8_8_;
  w1_04[2] = auVar5._8_8_;
  w1_04[3] = auVar6._0_8_;
  _r_05[1] = in_stack_fffffffffffffcc0;
  _r_05[0] = in_stack_fffffffffffffcb8;
  _r_05[2] = in_stack_fffffffffffffcc8;
  _r_05[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_04,w1_04,auVar4._0_8_,in1_07,_r_05,in_stack_fffffffffffffcb4);
  w0_05[1] = auVar7._0_8_;
  w0_05[0] = auVar6._8_8_;
  w0_05[2] = auVar7._8_8_;
  w0_05[3] = lVar3;
  w1_05[1] = auVar5._0_8_;
  w1_05[0] = auVar4._8_8_;
  w1_05[2] = auVar5._8_8_;
  w1_05[3] = auVar6._0_8_;
  _r_06[1] = in_stack_fffffffffffffcc0;
  _r_06[0] = in_stack_fffffffffffffcb8;
  _r_06[2] = in_stack_fffffffffffffcc8;
  _r_06[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_05,w1_05,auVar4._0_8_,in1_07,_r_06,in_stack_fffffffffffffcb4);
  w0_06[1] = auVar7._0_8_;
  w0_06[0] = auVar6._8_8_;
  w0_06[2] = auVar7._8_8_;
  w0_06[3] = lVar3;
  w1_06[1] = auVar5._0_8_;
  w1_06[0] = auVar4._8_8_;
  w1_06[2] = auVar5._8_8_;
  w1_06[3] = auVar6._0_8_;
  _r_07[1] = in_stack_fffffffffffffcc0;
  _r_07[0] = in_stack_fffffffffffffcb8;
  _r_07[2] = in_stack_fffffffffffffcc8;
  _r_07[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_06,w1_06,auVar4._0_8_,in1_07,_r_07,in_stack_fffffffffffffcb4);
  w0_07[1] = auVar7._0_8_;
  w0_07[0] = auVar6._8_8_;
  w0_07[2] = auVar7._8_8_;
  w0_07[3] = lVar3;
  w1_07[1] = auVar5._0_8_;
  w1_07[0] = auVar4._8_8_;
  w1_07[2] = auVar5._8_8_;
  w1_07[3] = auVar6._0_8_;
  _r_08[1] = in_stack_fffffffffffffcc0;
  _r_08[0] = in_stack_fffffffffffffcb8;
  _r_08[2] = in_stack_fffffffffffffcc8;
  _r_08[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_07,w1_07,auVar4._0_8_,in1_07,_r_08,in_stack_fffffffffffffcb4);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  btf_16_adds_subs_avx2(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28);
  w0_08[1] = auVar7._0_8_;
  w0_08[0] = auVar6._8_8_;
  w0_08[2] = auVar7._8_8_;
  w0_08[3] = lVar3;
  w1_08[1] = auVar5._0_8_;
  w1_08[0] = auVar4._8_8_;
  w1_08[2] = auVar5._8_8_;
  w1_08[3] = auVar6._0_8_;
  _r_09[1] = in_stack_fffffffffffffcc0;
  _r_09[0] = in_stack_fffffffffffffcb8;
  _r_09[2] = in_stack_fffffffffffffcc8;
  _r_09[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_08,w1_08,auVar4._0_8_,in1_07,_r_09,in_stack_fffffffffffffcb4);
  w0_09[1] = auVar7._0_8_;
  w0_09[0] = auVar6._8_8_;
  w0_09[2] = auVar7._8_8_;
  w0_09[3] = lVar3;
  w1_09[1] = auVar5._0_8_;
  w1_09[0] = auVar4._8_8_;
  w1_09[2] = auVar5._8_8_;
  w1_09[3] = auVar6._0_8_;
  _r_10[1] = in_stack_fffffffffffffcc0;
  _r_10[0] = in_stack_fffffffffffffcb8;
  _r_10[2] = in_stack_fffffffffffffcc8;
  _r_10[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_09,w1_09,auVar4._0_8_,in1_07,_r_10,in_stack_fffffffffffffcb4);
  w0_10[1] = auVar7._0_8_;
  w0_10[0] = auVar6._8_8_;
  w0_10[2] = auVar7._8_8_;
  w0_10[3] = lVar3;
  w1_10[1] = auVar5._0_8_;
  w1_10[0] = auVar4._8_8_;
  w1_10[2] = auVar5._8_8_;
  w1_10[3] = auVar6._0_8_;
  _r_11[1] = in_stack_fffffffffffffcc0;
  _r_11[0] = in_stack_fffffffffffffcb8;
  _r_11[2] = in_stack_fffffffffffffcc8;
  _r_11[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_10,w1_10,auVar4._0_8_,in1_07,_r_11,in_stack_fffffffffffffcb4);
  w0_11[1] = auVar7._0_8_;
  w0_11[0] = auVar6._8_8_;
  w0_11[2] = auVar7._8_8_;
  w0_11[3] = lVar3;
  w1_11[1] = auVar5._0_8_;
  w1_11[0] = auVar4._8_8_;
  w1_11[2] = auVar5._8_8_;
  w1_11[3] = auVar6._0_8_;
  _r_12[1] = in_stack_fffffffffffffcc0;
  _r_12[0] = in_stack_fffffffffffffcb8;
  _r_12[2] = in_stack_fffffffffffffcc8;
  _r_12[3] = in_stack_fffffffffffffcd0;
  btf_16_w16_avx2(w0_11,w1_11,auVar4._0_8_,in1_07,_r_12,in_stack_fffffffffffffcb4);
  *in_RSI = local_520;
  in_RSI[1] = uStackY_518;
  in_RSI[2] = CONCAT44(uStack_50c,CONCAT22(in_stack_fffffffffffffaf2,in_stack_fffffffffffffaf0));
  in_RSI[3] = uStack_508;
  in_RSI[4] = local_420;
  in_RSI[5] = uStack_418;
  in_RSI[6] = uStack_410;
  in_RSI[7] = uStack_408;
  in_RSI[8] = local_4a0;
  in_RSI[9] = in_stack_fffffffffffffb68;
  in_RSI[10] = in_stack_fffffffffffffb70;
  in_RSI[0xb] = uStack_488;
  in_RSI[0xc] = local_3a0;
  in_RSI[0xd] = uStack_398;
  in_RSI[0xe] = uStack_390;
  in_RSI[0xf] = uStack_388;
  in_RSI[0x10] = in_stack_fffffffffffffb20;
  in_RSI[0x11] = in_stack_fffffffffffffb28;
  in_RSI[0x12] = in_stack_fffffffffffffb30;
  in_RSI[0x13] = in_stack_fffffffffffffb38;
  in_RSI[0x14] = local_3e0;
  in_RSI[0x15] = uStack_3d8;
  in_RSI[0x16] = uStack_3d0;
  in_RSI[0x17] = uStack_3c8;
  in_RSI[0x18] = local_460;
  in_RSI[0x19] = uStack_458;
  in_RSI[0x1a] = uStack_450;
  in_RSI[0x1b] = uStack_448;
  in_RSI[0x1c] = local_360;
  in_RSI[0x1d] = uStack_358;
  in_RSI[0x1e] = CONCAT44(in_stack_fffffffffffffcb4,uStack_350);
  in_RSI[0x1f] = in_stack_fffffffffffffcb8;
  in_RSI[0x20] = local_500;
  in_RSI[0x21] = uStack_4f8;
  in_RSI[0x22] = uStack_4f0;
  in_RSI[0x23] = in_stack_fffffffffffffb18;
  in_RSI[0x24] = local_400;
  in_RSI[0x25] = uStack_3f8;
  in_RSI[0x26] = uStack_3f0;
  in_RSI[0x27] = uStack_3e8;
  in_RSI[0x28] = local_480;
  in_RSI[0x29] = uStack_478;
  in_RSI[0x2a] = uStack_470;
  in_RSI[0x2b] = uStack_468;
  in_RSI[0x2c] = local_380;
  in_RSI[0x2d] = uStack_378;
  in_RSI[0x2e] = uStack_370;
  in_RSI[0x2f] = uStack_368;
  in_RSI[0x30] = in_stack_fffffffffffffb40;
  in_RSI[0x31] = in_stack_fffffffffffffb48;
  in_RSI[0x32] = in_stack_fffffffffffffb50;
  in_RSI[0x33] = uStack_4a8;
  in_RSI[0x34] = local_3c0;
  in_RSI[0x35] = uStack_3b8;
  in_RSI[0x36] = uStack_3b0;
  in_RSI[0x37] = uStack_3a8;
  in_RSI[0x38] = local_440;
  in_RSI[0x39] = uStack_438;
  in_RSI[0x3a] = uStack_430;
  in_RSI[0x3b] = uStack_428;
  in_RSI[0x3c] = in_stack_fffffffffffffcc0;
  in_RSI[0x3d] = in_stack_fffffffffffffcc8;
  in_RSI[0x3e] = in_stack_fffffffffffffcd0;
  in_RSI[0x3f] = uStack_328;
  return;
}

Assistant:

static inline void fdct16x16_new_avx2(const __m256i *input, __m256i *output,
                                      int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i _r = _mm256_set1_epi32(1 << (cos_bit - 1));

  __m256i cospi_m32_p32 = pair_set_w16_epi16(-cospi[32], cospi[32]);
  __m256i cospi_p32_p32 = pair_set_w16_epi16(cospi[32], cospi[32]);
  __m256i cospi_p32_m32 = pair_set_w16_epi16(cospi[32], -cospi[32]);
  __m256i cospi_p48_p16 = pair_set_w16_epi16(cospi[48], cospi[16]);
  __m256i cospi_m16_p48 = pair_set_w16_epi16(-cospi[16], cospi[48]);
  __m256i cospi_m48_m16 = pair_set_w16_epi16(-cospi[48], -cospi[16]);
  __m256i cospi_p56_p08 = pair_set_w16_epi16(cospi[56], cospi[8]);
  __m256i cospi_m08_p56 = pair_set_w16_epi16(-cospi[8], cospi[56]);
  __m256i cospi_p24_p40 = pair_set_w16_epi16(cospi[24], cospi[40]);
  __m256i cospi_m40_p24 = pair_set_w16_epi16(-cospi[40], cospi[24]);
  __m256i cospi_p60_p04 = pair_set_w16_epi16(cospi[60], cospi[4]);
  __m256i cospi_m04_p60 = pair_set_w16_epi16(-cospi[4], cospi[60]);
  __m256i cospi_p28_p36 = pair_set_w16_epi16(cospi[28], cospi[36]);
  __m256i cospi_m36_p28 = pair_set_w16_epi16(-cospi[36], cospi[28]);
  __m256i cospi_p44_p20 = pair_set_w16_epi16(cospi[44], cospi[20]);
  __m256i cospi_m20_p44 = pair_set_w16_epi16(-cospi[20], cospi[44]);
  __m256i cospi_p12_p52 = pair_set_w16_epi16(cospi[12], cospi[52]);
  __m256i cospi_m52_p12 = pair_set_w16_epi16(-cospi[52], cospi[12]);

  // stage 1
  __m256i x1[16];
  btf_16_adds_subs_out_avx2(&x1[0], &x1[15], input[0], input[15]);
  btf_16_adds_subs_out_avx2(&x1[1], &x1[14], input[1], input[14]);
  btf_16_adds_subs_out_avx2(&x1[2], &x1[13], input[2], input[13]);
  btf_16_adds_subs_out_avx2(&x1[3], &x1[12], input[3], input[12]);
  btf_16_adds_subs_out_avx2(&x1[4], &x1[11], input[4], input[11]);
  btf_16_adds_subs_out_avx2(&x1[5], &x1[10], input[5], input[10]);
  btf_16_adds_subs_out_avx2(&x1[6], &x1[9], input[6], input[9]);
  btf_16_adds_subs_out_avx2(&x1[7], &x1[8], input[7], input[8]);

  // stage 2
  btf_16_adds_subs_avx2(&x1[0], &x1[7]);
  btf_16_adds_subs_avx2(&x1[1], &x1[6]);
  btf_16_adds_subs_avx2(&x1[2], &x1[5]);
  btf_16_adds_subs_avx2(&x1[3], &x1[4]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[11], &x1[12], _r, cos_bit);

  // stage 3
  btf_16_adds_subs_avx2(&x1[0], &x1[3]);
  btf_16_adds_subs_avx2(&x1[1], &x1[2]);
  btf_16_w16_avx2(cospi_m32_p32, cospi_p32_p32, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[11]);
  btf_16_adds_subs_avx2(&x1[9], &x1[10]);
  btf_16_adds_subs_avx2(&x1[15], &x1[12]);
  btf_16_adds_subs_avx2(&x1[14], &x1[13]);

  // stage 4
  btf_16_w16_avx2(cospi_p32_p32, cospi_p32_m32, &x1[0], &x1[1], _r, cos_bit);
  btf_16_w16_avx2(cospi_p48_p16, cospi_m16_p48, &x1[2], &x1[3], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[4], &x1[5]);
  btf_16_adds_subs_avx2(&x1[7], &x1[6]);
  btf_16_w16_avx2(cospi_m16_p48, cospi_p48_p16, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_m48_m16, cospi_m16_p48, &x1[10], &x1[13], _r, cos_bit);

  // stage 5
  btf_16_w16_avx2(cospi_p56_p08, cospi_m08_p56, &x1[4], &x1[7], _r, cos_bit);
  btf_16_w16_avx2(cospi_p24_p40, cospi_m40_p24, &x1[5], &x1[6], _r, cos_bit);
  btf_16_adds_subs_avx2(&x1[8], &x1[9]);
  btf_16_adds_subs_avx2(&x1[11], &x1[10]);
  btf_16_adds_subs_avx2(&x1[12], &x1[13]);
  btf_16_adds_subs_avx2(&x1[15], &x1[14]);

  // stage 6
  btf_16_w16_avx2(cospi_p60_p04, cospi_m04_p60, &x1[8], &x1[15], _r, cos_bit);
  btf_16_w16_avx2(cospi_p28_p36, cospi_m36_p28, &x1[9], &x1[14], _r, cos_bit);
  btf_16_w16_avx2(cospi_p44_p20, cospi_m20_p44, &x1[10], &x1[13], _r, cos_bit);
  btf_16_w16_avx2(cospi_p12_p52, cospi_m52_p12, &x1[11], &x1[12], _r, cos_bit);

  // stage 7
  output[0] = x1[0];
  output[1] = x1[8];
  output[2] = x1[4];
  output[3] = x1[12];
  output[4] = x1[2];
  output[5] = x1[10];
  output[6] = x1[6];
  output[7] = x1[14];
  output[8] = x1[1];
  output[9] = x1[9];
  output[10] = x1[5];
  output[11] = x1[13];
  output[12] = x1[3];
  output[13] = x1[11];
  output[14] = x1[7];
  output[15] = x1[15];
}